

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  char cVar3;
  char *pcVar4;
  void *pvVar5;
  long *in_RSI;
  TransformPromiseNodeBase *this_00;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise114;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  SourceLocation local_48;
  _func_int **local_30;
  
  (**(code **)(*in_RSI + 0x18))(&local_48);
  pcVar4 = local_48.function;
  cVar3 = (char)local_48.fileName;
  if ((char)local_48.fileName == '\x01') {
    local_58.ptr = (PromiseNode *)local_48.function;
    local_48.function = (char *)0x0;
    pPVar1 = *(PromiseArena **)((long)pcVar4 + 8);
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)pcVar4 - (long)pPVar1) < 0x28) {
      pvVar5 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:115:25)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00387248;
      *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
    }
    else {
      *(PromiseArena **)((long)pcVar4 + 8) = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)((long)pcVar4 + -0x30))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:115:25)>
                 ::anon_class_1_0_00000001_for_func::operator());
      ((PromiseArenaMember *)((long)pcVar4 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00387248;
      ((PromiseArenaMember *)((long)pcVar4 + -0x20))->_vptr_PromiseArenaMember =
           (_func_int **)pPVar1;
    }
    local_48.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_48.function = "then";
    local_48.lineNumber = 0x58b;
    local_48.columnNumber = 0x4c;
    local_50.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_30,&local_50,&local_48);
    OVar2.ptr = local_50.ptr;
    this->_vptr_ClientHook = local_30;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
  }
  else {
    kj::_::readyNow();
    this->_vptr_ClientHook = (_func_int **)local_48.fileName;
  }
  OVar2.ptr = local_58.ptr;
  if ((cVar3 == '\x01') && (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0))
  {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_SOME(promise, whenMoreResolved()) {
    return promise.then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }
}